

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void putbuffer(void *data,int size)

{
  int addr;
  int size_local;
  void *data_local;
  
  if (size != 0) {
    if (bank < 0xf0) {
      if (rom_limit < loccnt + size + bank * 0x2000) {
        fatal_error("ROM overflow!");
        return;
      }
      if (pass == 1) {
        if (data == (void *)0x0) {
          memset(rom[bank] + loccnt,0,(long)size);
          memset(map[bank] + loccnt,section + page * 0x20 & 0xff,(long)size);
        }
        else {
          memcpy(rom[bank] + loccnt,data,(long)size);
          memset(map[bank] + loccnt,section + page * 0x20 & 0xff,(long)size);
        }
      }
    }
    else if (0x1fff < loccnt + size) {
      fatal_error("PROC overflow!");
      return;
    }
    bank = (loccnt + size >> 0xd) + bank;
    loccnt = loccnt + size & 0x1fff;
    if (((bank < 0xf0) && (max_bank < bank)) && (max_bank = bank, loccnt == 0)) {
      max_bank = bank + -1;
    }
  }
  return;
}

Assistant:

void
putbuffer(void *data, int size)
{
	int addr;

	/* check size */
	if (size == 0)
		return;

	/* check if the buffer will fit in the rom */
	if (bank >= RESERVED_BANK) {
		addr  = loccnt + size;

		if (addr > 0x1FFF) {
			fatal_error("PROC overflow!");
			return;
		}
	}
	else {
		addr  = loccnt + size + (bank << 13);

		if (addr > rom_limit) {
			fatal_error("ROM overflow!");
			return;
		}

		/* copy the buffer */
		if (pass == LAST_PASS) {
			if (data) {
				memcpy(&rom[bank][loccnt], data, size);
				memset(&map[bank][loccnt], section + (page << 5), size);
			}
			else {
				memset(&rom[bank][loccnt], 0, size);
				memset(&map[bank][loccnt], section + (page << 5), size);
			}
		}
	}

	/* update the location counter */
	bank  += (loccnt + size) >> 13;
	loccnt = (loccnt + size) & 0x1FFF;

	/* update rom size */
	if (bank < RESERVED_BANK) {
		if (bank > max_bank) {
			if (loccnt)
				max_bank = bank;
			else
				max_bank = bank - 1;
		}
	}
}